

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  ushort uVar2;
  bool bVar3;
  sqlite3_stmt *pStmt_00;
  int iVar4;
  int iVar5;
  char **p;
  char *pcVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  sqlite3_stmt *pStmt;
  void *local_60;
  sqlite3_callback local_58;
  char *zLeftover;
  sqlite3 *local_48;
  ulong local_40;
  char **local_38;
  
  pStmt = (sqlite3_stmt *)0x0;
  local_58 = xCallback;
  iVar4 = sqlite3SafetyCheckOk(db);
  if (iVar4 == 0) {
    iVar4 = sqlite3MisuseError(0x1cb04);
    return iVar4;
  }
  pcVar6 = "";
  if (zSql != (char *)0x0) {
    pcVar6 = zSql;
  }
  local_38 = pzErrMsg;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3Error(db,0);
  iVar4 = 0;
  do {
    if (iVar4 != 0) {
LAB_00131a38:
      p = (char **)0x0;
LAB_00131a3b:
      if (pStmt != (sqlite3_stmt *)0x0) {
        sqlite3VdbeFinalize((Vdbe *)pStmt);
      }
      sqlite3DbFree(db,p);
      iVar4 = sqlite3ApiExit(db,iVar4);
      ppcVar10 = local_38;
      if ((local_38 == (char **)0x0) || (iVar4 == 0)) {
        if (local_38 != (char **)0x0) {
          *local_38 = (char *)0x0;
        }
      }
      else {
        pcVar6 = sqlite3_errmsg(db);
        pcVar6 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar6);
        *ppcVar10 = pcVar6;
        if (pcVar6 == (char *)0x0) {
          iVar4 = 7;
          sqlite3Error(db,7);
        }
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      return iVar4;
    }
    if (*pcVar6 == '\0') {
      iVar4 = 0;
      goto LAB_00131a38;
    }
    pStmt = (sqlite3_stmt *)0x0;
    iVar4 = sqlite3_prepare_v2(db,pcVar6,-1,&pStmt,&zLeftover);
    if (iVar4 == 0) {
      if (pStmt == (sqlite3_stmt *)0x0) {
        iVar4 = 0;
        pcVar6 = zLeftover;
      }
      else {
        uVar2 = *(ushort *)(pStmt + 0xbc);
        uVar9 = (ulong)uVar2;
        local_40 = (ulong)uVar2 << 4 | 8;
        p = (char **)0x0;
        bVar3 = false;
        ppcVar10 = (char **)0x0;
        local_60 = pArg;
        local_48 = db;
        do {
          iVar4 = sqlite3_step(pStmt);
          if (local_58 != (sqlite3_callback)0x0) {
            if (iVar4 == 100) {
              if (!bVar3) goto LAB_00131917;
LAB_00131959:
              ppcVar10 = p + uVar9;
              for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                puVar7 = sqlite3_column_text(pStmt,(int)uVar8);
                ppcVar10[uVar8] = (char *)puVar7;
                if ((puVar7 == (uchar *)0x0) &&
                   (iVar5 = sqlite3_column_type(pStmt,(int)uVar8), iVar5 != 5)) {
                  sqlite3OomFault(db);
                  iVar4 = 100;
                  goto LAB_00131a3b;
                }
              }
              ppcVar10[uVar9] = (char *)0x0;
            }
            else {
              if (((iVar4 != 0x65) || (bVar3)) || ((db->flags & 0x100) == 0)) break;
LAB_00131917:
              p = (char **)sqlite3DbMallocRaw(db,local_40);
              pStmt_00 = pStmt;
              if (p == (char **)0x0) goto LAB_00131a38;
              for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                pcVar6 = sqlite3_column_name(pStmt_00,(int)uVar8);
                p[uVar8] = pcVar6;
              }
              db = local_48;
              if (iVar4 == 100) goto LAB_00131959;
            }
            iVar5 = (*local_58)(local_60,(uint)uVar2,ppcVar10,p);
            if (iVar5 != 0) {
              sqlite3VdbeFinalize((Vdbe *)pStmt);
              pStmt = (sqlite3_stmt *)0x0;
              iVar4 = 4;
              sqlite3Error(db,4);
              goto LAB_00131a3b;
            }
            bVar3 = true;
          }
        } while (iVar4 == 100);
        iVar4 = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = (sqlite3_stmt *)0x0;
        pcVar6 = zLeftover + -1;
        do {
          pbVar1 = (byte *)(pcVar6 + 1);
          pcVar6 = pcVar6 + 1;
        } while ((""[*pbVar1] & 1) != 0);
        sqlite3DbFree(db,p);
        pArg = local_60;
      }
    }
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}